

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O2

shared_ptr<slang::syntax::SyntaxTree>
slang::syntax::SyntaxTree::fromLibraryMapFile
          (string_view path,SourceManager *sourceManager,Bag *options)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  SyntaxTree *this;
  Bag *in_R8;
  shared_ptr<slang::syntax::SyntaxTree> sVar2;
  path local_80;
  BufferOrError buffer;
  string_view path_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  path_local._M_len = (size_t)path._M_str;
  this = (SyntaxTree *)path._M_len;
  path_local._M_str = (char *)sourceManager;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_80,&path_local,auto_format);
  SourceManager::readSource
            (&buffer,(SourceManager *)options,&local_80,(SourceLibrary *)0x0,0xffffffffffffffff);
  std::filesystem::__cxx11::path::~path(&local_80);
  if (buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value ==
      false) {
    *(undefined8 *)this = 0;
    this->rootNode = (SyntaxNode *)0x0;
    _Var1._M_pi = extraout_RDX;
  }
  else {
    sVar2 = fromLibraryMapBuffer(this,(SourceBuffer *)&buffer,(SourceManager *)options,in_R8);
    _Var1 = sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var1._M_pi;
  sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<slang::syntax::SyntaxTree>)
         sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SyntaxTree> SyntaxTree::fromLibraryMapFile(std::string_view path,
                                                           SourceManager& sourceManager,
                                                           const Bag& options) {
    auto buffer = sourceManager.readSource(path, /* library */ nullptr);
    if (!buffer)
        return nullptr;

    return fromLibraryMapBuffer(*buffer, sourceManager, options);
}